

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

bool __thiscall
cmake::FindPackage(cmake *this,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *args)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  cmGlobalGenerator *this_00;
  cmMakefile *this_01;
  char *pcVar4;
  cmTarget *this_02;
  cmGeneratorTarget *this_03;
  cmLocalGenerator *pcVar5;
  bool in_DL;
  bool collapse;
  bool collapse_00;
  bool collapse_01;
  pointer lib;
  string includes;
  string includeFlags;
  string definitions;
  string linkPath;
  string language;
  string packageName;
  string mode;
  string systemFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includeDirs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libList;
  string linkFlags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srcs;
  Snapshot snapshot;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&systemFile,(SystemTools *)0x1,in_DL);
  SetHomeDirectory(this,&systemFile);
  std::__cxx11::string::~string((string *)&systemFile);
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&systemFile,(SystemTools *)0x1,collapse)
  ;
  SetHomeOutputDirectory(this,&systemFile);
  std::__cxx11::string::~string((string *)&systemFile);
  this_00 = (cmGlobalGenerator *)operator_new(0x530);
  cmGlobalGenerator::cmGlobalGenerator(this_00,this);
  SetGlobalGenerator(this,this_00);
  snapshot.Position.Position = (this->CurrentSnapshot).Position.Position;
  snapshot.State = (this->CurrentSnapshot).State;
  snapshot.Position.Tree = (this->CurrentSnapshot).Position.Tree;
  cmState::Snapshot::GetDirectory((Directory *)&systemFile,&snapshot);
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            (&language,(SystemTools *)0x1,collapse_00);
  cmState::Directory::SetCurrentBinary((Directory *)&systemFile,&language);
  std::__cxx11::string::~string((string *)&language);
  cmState::Snapshot::GetDirectory((Directory *)&systemFile,&snapshot);
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            (&language,(SystemTools *)0x1,collapse_01);
  cmState::Directory::SetCurrentSource((Directory *)&systemFile,&language);
  std::__cxx11::string::~string((string *)&language);
  cmState::Snapshot::SetDefaultDefinitions(&snapshot);
  this_01 = (cmMakefile *)operator_new(0x730);
  cmMakefile::cmMakefile(this_01,this_00,&snapshot);
  cmGlobalGenerator::AddMakefile(this_00,this_01);
  cmMakefile::SetArgcArgv(this_01,args);
  cmMakefile::GetModulesFile_abi_cxx11_(&systemFile,this_01,"CMakeFindPackageMode.cmake");
  cmMakefile::ReadListFile(this_01,systemFile._M_dataplus._M_p);
  std::__cxx11::string::string((string *)&mode,"LANGUAGE",(allocator *)&packageName);
  pcVar4 = cmMakefile::GetSafeDefinition(this_01,&mode);
  std::__cxx11::string::string((string *)&language,pcVar4,(allocator *)&includes);
  std::__cxx11::string::~string((string *)&mode);
  std::__cxx11::string::string((string *)&packageName,"MODE",(allocator *)&includes);
  pcVar4 = cmMakefile::GetSafeDefinition(this_01,&packageName);
  std::__cxx11::string::string((string *)&mode,pcVar4,(allocator *)&includeFlags);
  std::__cxx11::string::~string((string *)&packageName);
  std::__cxx11::string::string((string *)&includes,"NAME",(allocator *)&includeFlags);
  pcVar4 = cmMakefile::GetSafeDefinition(this_01,&includes);
  std::__cxx11::string::string((string *)&packageName,pcVar4,(allocator *)&definitions);
  std::__cxx11::string::~string((string *)&includes);
  std::__cxx11::string::string((string *)&includes,"PACKAGE_FOUND",(allocator *)&includeFlags);
  bVar1 = cmMakefile::IsOn(this_01,&includes);
  std::__cxx11::string::~string((string *)&includes);
  std::__cxx11::string::string((string *)&includes,"PACKAGE_QUIET",(allocator *)&includeFlags);
  bVar2 = cmMakefile::IsOn(this_01,&includes);
  std::__cxx11::string::~string((string *)&includes);
  if (bVar1) {
    bVar3 = std::operator==(&mode,"EXIST");
    if (!bVar3) {
      bVar2 = std::operator==(&mode,"COMPILE");
      if (bVar2) {
        std::__cxx11::string::string
                  ((string *)&includeFlags,"PACKAGE_INCLUDE_DIRS",(allocator *)&definitions);
        pcVar4 = cmMakefile::GetSafeDefinition(this_01,&includeFlags);
        std::__cxx11::string::string((string *)&includes,pcVar4,(allocator *)&linkPath);
        std::__cxx11::string::~string((string *)&includeFlags);
        includeDirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        includeDirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        includeDirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cmSystemTools::ExpandListArgument(&includes,&includeDirs,false);
        cmGlobalGenerator::CreateGenerationObjects(this_00,AllTargets);
        pcVar5 = *(this_00->LocalGenerators).
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string((string *)&definitions,"",(allocator *)&linkPath);
        cmLocalGenerator::GetIncludeFlags
                  (&includeFlags,pcVar5,&includeDirs,(cmGeneratorTarget *)0x0,&language,false,false,
                   &definitions);
        std::__cxx11::string::~string((string *)&definitions);
        std::__cxx11::string::string
                  ((string *)&linkPath,"PACKAGE_DEFINITIONS",(allocator *)&linkFlags);
        pcVar4 = cmMakefile::GetSafeDefinition(this_01,&linkPath);
        std::__cxx11::string::string((string *)&definitions,pcVar4,(allocator *)&local_50);
        std::__cxx11::string::~string((string *)&linkPath);
        printf("%s %s\n",includeFlags._M_dataplus._M_p,definitions._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&definitions);
        std::__cxx11::string::~string((string *)&includeFlags);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&includeDirs);
        std::__cxx11::string::~string((string *)&includes);
      }
      else {
        bVar2 = std::operator==(&mode,"LINK");
        if (bVar2) {
          srcs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          srcs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          srcs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          this_02 = cmMakefile::AddExecutable(this_01,"dummy",&srcs,true);
          std::__cxx11::string::string
                    ((string *)&includes,"LINKER_LANGUAGE",(allocator *)&includeFlags);
          cmTarget::SetProperty(this_02,&includes,language._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&includes);
          std::__cxx11::string::string
                    ((string *)&includeFlags,"PACKAGE_LIBRARIES",(allocator *)&definitions);
          pcVar4 = cmMakefile::GetSafeDefinition(this_01,&includeFlags);
          std::__cxx11::string::string((string *)&includes,pcVar4,(allocator *)&linkPath);
          std::__cxx11::string::~string((string *)&includeFlags);
          libList.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          libList.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          libList.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cmSystemTools::ExpandListArgument(&includes,&libList,false);
          for (lib = libList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
              lib != libList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish; lib = lib + 1) {
            std::__cxx11::string::string((string *)&includeFlags,"dummy",(allocator *)&definitions);
            cmMakefile::AddLinkLibraryForTarget(this_01,&includeFlags,lib,GENERAL_LibraryType);
            std::__cxx11::string::~string((string *)&includeFlags);
          }
          includeFlags._M_dataplus._M_p = (pointer)&includeFlags.field_2;
          includeFlags._M_string_length = 0;
          definitions._M_dataplus._M_p = (pointer)&definitions.field_2;
          definitions._M_string_length = 0;
          includeFlags.field_2._M_local_buf[0] = '\0';
          definitions.field_2._M_local_buf[0] = '\0';
          linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
          linkPath._M_string_length = 0;
          includeDirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)&includeDirs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          includeDirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          linkPath.field_2._M_local_buf[0] = '\0';
          includeDirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((ulong)includeDirs.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage &
                        0xffffffffffffff00);
          linkFlags._M_dataplus._M_p = (pointer)&linkFlags.field_2;
          linkFlags._M_string_length = 0;
          linkFlags.field_2._M_local_buf[0] = '\0';
          cmGlobalGenerator::CreateGenerationObjects(this_00,AllTargets);
          this_03 = cmGlobalGenerator::FindGeneratorTarget(this_00,&this_02->Name);
          pcVar5 = cmGeneratorTarget::GetLocalGenerator(this_03);
          cmLocalGenerator::GetTargetFlags
                    (pcVar5,&includeFlags,&definitions,&linkPath,(string *)&includeDirs,&linkFlags,
                     this_03,false);
          std::operator+(&local_70,&definitions,&linkPath);
          std::operator+(&local_50,&local_70,&includeFlags);
          std::__cxx11::string::operator=((string *)&includeFlags,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          puts(includeFlags._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&linkFlags);
          std::__cxx11::string::~string((string *)&includeDirs);
          std::__cxx11::string::~string((string *)&linkPath);
          std::__cxx11::string::~string((string *)&definitions);
          std::__cxx11::string::~string((string *)&includeFlags);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&libList);
          std::__cxx11::string::~string((string *)&includes);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&srcs);
        }
      }
      goto LAB_00374d89;
    }
    if (bVar2) goto LAB_00374d89;
    pcVar4 = "%s found.\n";
  }
  else {
    if (bVar2) goto LAB_00374d89;
    pcVar4 = "%s not found.\n";
  }
  printf(pcVar4,packageName._M_dataplus._M_p);
LAB_00374d89:
  std::__cxx11::string::~string((string *)&packageName);
  std::__cxx11::string::~string((string *)&mode);
  std::__cxx11::string::~string((string *)&language);
  std::__cxx11::string::~string((string *)&systemFile);
  return bVar1;
}

Assistant:

bool cmake::FindPackage(const std::vector<std::string>& args)
{
  this->SetHomeDirectory
    (cmSystemTools::GetCurrentWorkingDirectory());
  this->SetHomeOutputDirectory
    (cmSystemTools::GetCurrentWorkingDirectory());

  // if a generator was not yet created, temporarily create one
  cmGlobalGenerator *gg = new cmGlobalGenerator(this);
  this->SetGlobalGenerator(gg);

  cmState::Snapshot snapshot = this->GetCurrentSnapshot();
  snapshot.GetDirectory().SetCurrentBinary
    (cmSystemTools::GetCurrentWorkingDirectory());
  snapshot.GetDirectory().SetCurrentSource
    (cmSystemTools::GetCurrentWorkingDirectory());
  // read in the list file to fill the cache
  snapshot.SetDefaultDefinitions();
  cmMakefile* mf = new cmMakefile(gg, snapshot);
  gg->AddMakefile(mf);

  mf->SetArgcArgv(args);

  std::string systemFile = mf->GetModulesFile("CMakeFindPackageMode.cmake");
  mf->ReadListFile(systemFile.c_str());

  std::string language = mf->GetSafeDefinition("LANGUAGE");
  std::string mode = mf->GetSafeDefinition("MODE");
  std::string packageName = mf->GetSafeDefinition("NAME");
  bool packageFound = mf->IsOn("PACKAGE_FOUND");
  bool quiet = mf->IsOn("PACKAGE_QUIET");

  if (!packageFound)
    {
    if (!quiet)
      {
      printf("%s not found.\n", packageName.c_str());
      }
    }
  else if (mode == "EXIST")
    {
    if (!quiet)
      {
      printf("%s found.\n", packageName.c_str());
      }
    }
  else if (mode == "COMPILE")
    {
    std::string includes = mf->GetSafeDefinition("PACKAGE_INCLUDE_DIRS");
    std::vector<std::string> includeDirs;
    cmSystemTools::ExpandListArgument(includes, includeDirs);

    gg->CreateGenerationObjects();
    cmLocalGenerator* lg = gg->LocalGenerators[0];
    std::string includeFlags = lg->GetIncludeFlags(includeDirs, 0, language);

    std::string definitions = mf->GetSafeDefinition("PACKAGE_DEFINITIONS");
    printf("%s %s\n", includeFlags.c_str(), definitions.c_str());
    }
  else if (mode == "LINK")
    {
    const char* targetName = "dummy";
    std::vector<std::string> srcs;
    cmTarget* tgt = mf->AddExecutable(targetName, srcs, true);
    tgt->SetProperty("LINKER_LANGUAGE", language.c_str());

    std::string libs = mf->GetSafeDefinition("PACKAGE_LIBRARIES");
    std::vector<std::string> libList;
    cmSystemTools::ExpandListArgument(libs, libList);
    for(std::vector<std::string>::const_iterator libIt=libList.begin();
            libIt != libList.end();
            ++libIt)
      {
      mf->AddLinkLibraryForTarget(targetName, *libIt,
                                  GENERAL_LibraryType);
      }


    std::string linkLibs;
    std::string frameworkPath;
    std::string linkPath;
    std::string flags;
    std::string linkFlags;
    gg->CreateGenerationObjects();
    cmGeneratorTarget *gtgt = gg->FindGeneratorTarget(tgt->GetName());
    cmLocalGenerator* lg = gtgt->GetLocalGenerator();
    lg->GetTargetFlags(linkLibs, frameworkPath, linkPath, flags, linkFlags,
                       gtgt, false);
    linkLibs = frameworkPath + linkPath + linkLibs;

    printf("%s\n", linkLibs.c_str() );

/*    if ( use_win32 )
      {
      tgt->SetProperty("WIN32_EXECUTABLE", "ON");
      }
    if ( use_macbundle)
      {
      tgt->SetProperty("MACOSX_BUNDLE", "ON");
      }*/
    }

  // free generic one if generated
//  this->SetGlobalGenerator(0); // setting 0-pointer is not possible
//  delete gg; // this crashes inside the cmake instance

  return packageFound;
}